

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-iso8601.c
# Opt level: O3

void test_date(char *str,int64_t millis)

{
  char cVar1;
  size_t sVar2;
  int64_t v;
  bson_error_t error;
  undefined1 auStack_428 [8];
  undefined1 auStack_420 [512];
  code *pcStack_220;
  long local_218;
  undefined1 local_210 [512];
  
  pcStack_220 = (code *)0x12a1dc;
  sVar2 = strlen(str);
  pcStack_220 = (code *)0x12a1ee;
  cVar1 = _bson_iso8601_date_parse(str,sVar2 & 0xffffffff,&local_218,local_210);
  if (cVar1 == '\0') {
    pcStack_220 = (code *)0x12a20e;
    test_date_cold_1();
  }
  else if (local_218 == millis) {
    return;
  }
  pcStack_220 = test_date_should_fail;
  test_date_cold_2();
  pcStack_220 = (code *)str;
  sVar2 = strlen((char *)millis);
  cVar1 = _bson_iso8601_date_parse(millis,sVar2 & 0xffffffff,auStack_428,auStack_420);
  if (cVar1 == '\0') {
    return;
  }
  test_date_should_fail_cold_1();
  TestSuite_Add((TestSuite *)millis,"/bson/iter/test_string",test_bson_iter_utf8);
  TestSuite_Add((TestSuite *)millis,"/bson/iter/test_mixed",test_bson_iter_mixed);
  TestSuite_Add((TestSuite *)millis,"/bson/iter/test_overflow",test_bson_iter_overflow);
  TestSuite_Add((TestSuite *)millis,"/bson/iter/test_timeval",test_bson_iter_timeval);
  TestSuite_Add((TestSuite *)millis,"/bson/iter/test_trailing_null",test_bson_iter_trailing_null);
  TestSuite_Add((TestSuite *)millis,"/bson/iter/test_fuzz",test_bson_iter_fuzz);
  TestSuite_Add((TestSuite *)millis,"/bson/iter/test_regex",test_bson_iter_regex);
  TestSuite_Add((TestSuite *)millis,"/bson/iter/test_next_after_finish",
                test_bson_iter_next_after_finish);
  TestSuite_Add((TestSuite *)millis,"/bson/iter/test_find_case",test_bson_iter_find_case);
  TestSuite_Add((TestSuite *)millis,"/bson/iter/test_bson_iter_as_double",test_bson_iter_as_double);
  TestSuite_Add((TestSuite *)millis,"/bson/iter/test_overwrite_int32",test_bson_iter_overwrite_int32
               );
  TestSuite_Add((TestSuite *)millis,"/bson/iter/test_overwrite_int64",test_bson_iter_overwrite_int64
               );
  TestSuite_Add((TestSuite *)millis,"/bson/iter/test_overwrite_double",
                test_bson_iter_overwrite_double);
  TestSuite_Add((TestSuite *)millis,"/bson/iter/test_overwrite_bool",test_bson_iter_overwrite_bool);
  TestSuite_Add((TestSuite *)millis,"/bson/iter/test_bson_iter_overwrite_decimal128",
                test_bson_iter_overwrite_decimal128);
  TestSuite_Add((TestSuite *)millis,"/bson/iter/recurse",test_bson_iter_recurse);
  TestSuite_Add((TestSuite *)millis,"/bson/iter/init_find_case",test_bson_iter_init_find_case);
  TestSuite_Add((TestSuite *)millis,"/bson/iter/find_descendant",test_bson_iter_find_descendant);
  TestSuite_Add((TestSuite *)millis,"/bson/iter/as_bool",test_bson_iter_as_bool);
  TestSuite_Add((TestSuite *)millis,"/bson/iter/binary_deprecated",test_bson_iter_binary_deprecated)
  ;
  TestSuite_Add((TestSuite *)millis,"/bson/iter/from_data",test_bson_iter_from_data);
  return;
}

Assistant:

static void
test_date (const char *str, int64_t millis)
{
   int64_t v;
   bson_error_t error;

   if (!_bson_iso8601_date_parse (str, strlen (str), &v, &error)) {
      fprintf (stderr, "could not parse (%s)\n", str);
      abort ();
   }

   if (v != millis) {
      fprintf (stderr,
               "parsed value not correct: %" PRId64 " != %" PRId64 "\n",
               millis,
               v);

      fprintf (stderr, "parsing: [%s]\n", str);
      abort ();
   }
}